

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proxy_functions_detail.hpp
# Opt level: O2

Boxed_Value
chaiscript::dispatch::detail::
call_func<std::shared_ptr<TestBaseType>(*)(),std::shared_ptr<TestBaseType>>
          (_func_shared_ptr<TestBaseType> *sig,_func_shared_ptr<TestBaseType> **f,
          Function_Params *params,Type_Conversions_State *t_conversions)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  shared_ptr<TestBaseType> local_20;
  
  (*(code *)params->m_begin)(&local_20);
  Handle_Return<std::shared_ptr<TestBaseType>_&>::handle
            ((Handle_Return<std::shared_ptr<TestBaseType>_&> *)sig,&local_20);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_20.super___shared_ptr<TestBaseType,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)sig;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value
      call_func(Ret (*sig)(Params...), const Callable &f, const chaiscript::Function_Params &params, const Type_Conversions_State &t_conversions) {
        if constexpr (std::is_same_v<Ret, void>) {
          call_func(sig, std::index_sequence_for<Params...>{}, f, params, t_conversions);
          return Handle_Return<void>::handle();
        } else {
          return Handle_Return<Ret>::handle(call_func(sig, std::index_sequence_for<Params...>{}, f, params, t_conversions));
        }
      }